

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioDriver.cpp
# Opt level: O1

quint64 __thiscall AudioStream::estimateMIDITimestamp(AudioStream *this,MasterClockNanos midiNanos)

{
  uint uVar1;
  ulonglong uVar2;
  QDebug this_00;
  uint uVar3;
  quint64 qVar4;
  quint64 qVar5;
  long lVar6;
  QByteArrayView QVar7;
  QDebug local_68;
  QArrayData *local_60 [3];
  undefined4 local_48;
  undefined8 local_44;
  undefined8 uStack_3c;
  undefined4 local_34;
  char *local_30;
  
  do {
    uVar1 = (this->timeInfoChangeCount).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
            _q_value.super___atomic_base<int>._M_i;
    uVar3 = uVar1 & 1;
  } while (uVar1 != (this->timeInfoChangeCount).super_QAtomicInteger<int>.
                    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i);
  do {
    uVar1 = (this->renderedFramesChangeCount).super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i;
    uVar2 = this->renderedFramesCounts[uVar1 & 1];
  } while (uVar1 != (this->renderedFramesChangeCount).super_QAtomicInteger<int>.
                    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i);
  qVar5 = this->timeInfos[uVar3].lastPlayedFramesCount + (ulong)this->midiLatencyFrames +
          (long)((this->timeInfos[uVar3].actualSampleRate *
                 (double)(midiNanos - this->timeInfos[uVar3].lastPlayedNanos)) / 1000000000.0);
  lVar6 = qVar5 - uVar2;
  if (lVar6 < 0) {
    if (this->settings->midiLatency == 0) {
      this->midiLatencyFrames = this->midiLatencyFrames - (int)lVar6;
    }
    local_48 = 2;
    local_44 = 0;
    uStack_3c = 0;
    local_34 = 0;
    local_30 = "default";
    QMessageLogger::debug();
    this_00.stream = local_68.stream;
    QVar7.m_data = (storage_type *)0x1;
    QVar7.m_size = (qsizetype)local_60;
    QString::fromUtf8(QVar7);
    QTextStream::operator<<((QTextStream *)this_00.stream,(QString *)local_60);
    if (local_60[0] != (QArrayData *)0x0) {
      LOCK();
      (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_60[0],2,8);
      }
    }
    if (*(QTextStream *)(local_68.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_68.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_68.stream,uVar2);
    if (*(QTextStream *)(local_68.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_68.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_68.stream,qVar5);
    if (*(QTextStream *)(local_68.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_68.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_68.stream,lVar6);
    if (*(QTextStream *)(local_68.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_68.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_68.stream,this->midiLatencyFrames);
    if (*(QTextStream *)(local_68.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_68.stream,' ');
    }
    QDebug::~QDebug(&local_68);
  }
  qVar4 = 0;
  if (0 < (long)qVar5) {
    qVar4 = qVar5;
  }
  return qVar4;
}

Assistant:

quint64 AudioStream::estimateMIDITimestamp(const MasterClockNanos midiNanos) {
	TimeInfo timeInfo;
	takeSnapshot(timeInfo, timeInfos, timeInfoChangeCount);
	quint64 renderedFramesCount;
	takeSnapshot(renderedFramesCount, renderedFramesCounts, renderedFramesChangeCount);

	qint64 refFrameOffset = qint64(((midiNanos - timeInfo.lastPlayedNanos) * timeInfo.actualSampleRate) / MasterClock::NANOS_PER_SECOND);
	qint64 timestamp = qint64(timeInfo.lastPlayedFramesCount) + refFrameOffset + qint64(midiLatencyFrames);
	qint64 delay = timestamp - qint64(renderedFramesCount);
	if (delay < 0) {
		// Negative delay means our timing is broken. We want to absorb all the jitter while keeping the latency at the minimum.
		if (isAutoLatencyMode()) {
			midiLatencyFrames -= delay;
		}
		qDebug() << "L" << renderedFramesCount << timestamp << delay << midiLatencyFrames;
	}
	return timestamp < 0 ? 0 : quint64(timestamp);
}